

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O3

void __thiscall ll_grammar::ElemLeft::ElemLeft(ElemLeft *this,string *name,int key,bool isFinally)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  base_grammar::Elem::Elem(&this->super_Elem,&local_48,key,isFinally);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->expression_of_set).
  super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expression_of_set).
  super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expression_of_set).
  super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ElemLeft::ElemLeft(string name, int key, bool isFinally) : Elem(name, key, isFinally){}